

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O0

void __thiscall QDoubleSpinBoxPrivate::QDoubleSpinBoxPrivate(QDoubleSpinBoxPrivate *this)

{
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QAbstractSpinBoxPrivate *in_stack_ffffffffffffff70;
  QVariant *this_00;
  QVariant *this_01;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractSpinBoxPrivate::QAbstractSpinBoxPrivate(in_stack_ffffffffffffff70);
  *in_RDI = &PTR__QDoubleSpinBoxPrivate_00d1b488;
  in_RDI[0x7b] = 0;
  in_RDI[0x7c] = 0x4058ff5c28f5c28f;
  ::QVariant::QVariant(&local_28,(double)in_RDI[0x7b]);
  this_01 = (QVariant *)(in_RDI + 0x58);
  ::QVariant::operator=(this_01,(QVariant *)in_stack_ffffffffffffff70);
  ::QVariant::~QVariant(&local_28);
  this_00 = &local_48;
  ::QVariant::QVariant(this_00,(double)in_RDI[0x7c]);
  ::QVariant::operator=(this_01,this_00);
  ::QVariant::~QVariant(this_00);
  ::QVariant::operator=((QVariant *)(in_RDI + 0x54),(QVariant *)this_01);
  ::QVariant::QVariant(&local_68,1.0);
  ::QVariant::operator=(this_01,this_00);
  ::QVariant::~QVariant(&local_68);
  *(undefined4 *)((long)in_RDI + 0x3d4) = 2;
  *(undefined4 *)(in_RDI + 0x71) = 6;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QDoubleSpinBoxPrivate::QDoubleSpinBoxPrivate()
{
    actualMin = 0.0;
    actualMax = 99.99;
    minimum = QVariant(actualMin);
    maximum = QVariant(actualMax);
    value = minimum;
    singleStep = QVariant(1.0);
    decimals = 2;
    type = QMetaType::Double;
}